

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O1

void __thiscall GLRParser::GLRParser(GLRParser *this,CFG *cfg,bool verbose)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  pointer pcVar3;
  Production *pPVar4;
  size_t sVar5;
  uint __val;
  uint uVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  vector<Production_*,_std::allocator<Production_*>_> *__x;
  string *psVar12;
  GLRParser *pGVar13;
  GLRState *pGVar14;
  GLRState *this_00;
  _Rb_tree_node_base *p_Var15;
  _Rb_tree_node_base *p_Var16;
  undefined8 *puVar17;
  _Rb_tree_node_base *p_Var18;
  undefined8 uVar19;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  uint uVar20;
  _Self __tmp;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  pointer pbVar21;
  long lVar22;
  ulong uVar23;
  bool bVar24;
  pair<std::_Rb_tree_iterator<GLRState_*>,_bool> pVar25;
  undefined1 auVar26 [16];
  pair<std::_Rb_tree_iterator<Production_*>,_bool> pVar27;
  undefined1 auVar28 [16];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<Production_*> __l_01;
  initializer_list<Production_*> __l_02;
  string var;
  string startS;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prodToMarked;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> startClosure;
  string s;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> sMovedRightOfX;
  set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_> *__range2;
  Production *start;
  GLRState *closureY;
  vector<Production_*,_std::allocator<Production_*>_> productionsP;
  string oldStartState;
  GLRState *newState;
  GLRState *local_2e0;
  undefined1 local_2d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_290;
  Production **local_288;
  _Rb_tree_node_base *local_280;
  undefined1 local_278 [16];
  undefined1 local_268 [24];
  _Base_ptr local_250;
  undefined1 local_248 [16];
  undefined1 local_238 [32];
  undefined1 local_218 [32];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [32];
  undefined1 local_1c8 [32];
  _Rb_tree_node_base *local_1a8;
  _Base_ptr p_Stack_1a0;
  _Rb_tree<GLRState*,GLRState*,std::_Identity<GLRState*>,std::less<GLRState*>,std::allocator<GLRState*>>
  *local_198;
  GLRParser *local_190;
  GLRState *local_188 [2];
  undefined1 local_178 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  Production **local_158;
  _Base_ptr local_150;
  _Base_ptr local_148;
  _Base_ptr local_140;
  _Base_ptr local_138 [2];
  string local_128;
  GLRState *local_108;
  string local_100;
  string local_e0;
  _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
  local_c0;
  _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
  local_90;
  _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
  local_60;
  
  this->verbose = verbose;
  local_290 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)&this->nonTerminalsV;
  p_Var1 = &(this->nonTerminalsV)._M_t._M_impl.super__Rb_tree_header;
  (this->nonTerminalsV)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nonTerminalsV)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nonTerminalsV)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->nonTerminalsV)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_150 = (_Base_ptr)&this->terminalsT;
  p_Var1 = &(this->terminalsT)._M_t._M_impl.super__Rb_tree_header;
  (this->terminalsT)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->terminalsT)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nonTerminalsV)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->acceptState = (GLRState *)0x0;
  (this->terminalsT)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->terminalsT)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->terminalsT)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_198 = (_Rb_tree<GLRState*,GLRState*,std::_Identity<GLRState*>,std::less<GLRState*>,std::allocator<GLRState*>>
               *)&this->states;
  local_280 = &(this->states)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_280;
  (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_280;
  (this->states)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  CFG::splitUpLongerTerminals(cfg);
  pvVar11 = CFG::getNonTerminalsV_abi_cxx11_(cfg);
  pbVar2 = (pvVar11->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar21 = (pvVar11->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar21 != pbVar2;
      pbVar21 = pbVar21 + 1) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>(local_290,pbVar21);
  }
  pvVar11 = CFG::getTerminalsT_abi_cxx11_(cfg);
  pbVar2 = (pvVar11->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar21 = (pvVar11->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar21 != pbVar2;
      pbVar21 = pbVar21 + 1) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_150,pbVar21);
  }
  __x = CFG::getProductionsP(cfg);
  std::vector<Production_*,_std::allocator<Production_*>_>::vector
            ((vector<Production_*,_std::allocator<Production_*>_> *)(local_178 + 0x10),__x);
  psVar12 = CFG::getStartS_abi_cxx11_(cfg);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  pcVar3 = (psVar12->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b0,pcVar3,pcVar3 + psVar12->_M_string_length);
  local_148 = (_Base_ptr)local_138;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,local_2b0._M_dataplus._M_p,
             local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
  startStateName_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&local_2b0,(string *)local_1c8);
  pcVar3 = local_1c8 + 0x10;
  if ((pointer)local_1c8._0_8_ != pcVar3) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>(local_290,&local_2b0);
  pGVar13 = (GLRParser *)operator_new(0x38);
  local_1c8._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c8,local_148,(long)&local_148->_M_color + (long)&local_140->_M_color);
  __l._M_len = 1;
  __l._M_array = (iterator)local_1c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_248,__l,(allocator_type *)local_278);
  Production::Production
            ((Production *)pGVar13,&local_2b0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_248);
  if ((pointer)local_1c8._0_8_ != pcVar3) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  local_190 = pGVar13;
  if ((Production **)local_168._8_8_ == local_158) {
    std::vector<Production*,std::allocator<Production*>>::_M_realloc_insert<Production*const&>
              ((vector<Production*,std::allocator<Production*>> *)(local_178 + 0x10),
               (iterator)local_168._8_8_,(Production **)&local_190);
  }
  else {
    *(GLRParser **)local_168._8_8_ = pGVar13;
    local_168._8_8_ = local_168._8_8_ + 8;
  }
  pGVar14 = (GLRState *)operator_new(0xb8);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"accept","");
  this_00 = (GLRState *)operator_new(0x38);
  local_1c8._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"accept","");
  local_248._0_8_ = local_238;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_248,local_2b0._M_dataplus._M_p,
             local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_248;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_278,__l_00,(allocator_type *)local_218);
  Production::Production
            ((Production *)this_00,(string *)local_1c8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_278);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_1f8;
  local_1f8._0_8_ = this_00;
  std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::set
            ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)&local_60,
             __l_01,(less<Production_*> *)local_2d0,(allocator_type *)local_188);
  GLRState::GLRState(pGVar14,&local_100,
                     (set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                     &local_60);
  this->acceptState = pGVar14;
  std::
  _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
  ::~_Rb_tree(&local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_278);
  if ((GLRParser *)local_248._0_8_ != (GLRParser *)local_238) {
    operator_delete((void *)local_248._0_8_,(ulong)(local_238._0_8_ + 1));
  }
  if ((pointer)local_1c8._0_8_ != pcVar3) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  local_1c8._24_8_ = local_1c8 + 8;
  local_1c8._16_8_ = 0;
  local_1c8._0_8_ = (pointer)0x0;
  local_1c8._8_8_ = 0;
  p_Stack_1a0 = (_Base_ptr)0x0;
  local_288 = (Production **)local_168._8_8_;
  local_1a8 = (_Rb_tree_node_base *)local_1c8._24_8_;
  if (local_168._M_allocated_capacity != local_168._8_8_) {
    uVar19 = local_168._M_allocated_capacity;
    do {
      pPVar4 = *(Production **)uVar19;
      pvVar11 = Production::getToP_abi_cxx11_(pPVar4);
      uVar23 = 0xffffffffffffffff;
      lVar22 = 0;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_278,pvVar11);
        uVar7 = local_278._0_8_;
        getMarker_abi_cxx11_();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_insert_rval((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_278,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (uVar7 + lVar22),(value_type *)local_248);
        if ((GLRParser *)local_248._0_8_ != (GLRParser *)local_238) {
          operator_delete((void *)local_248._0_8_,(ulong)(local_238._0_8_ + 1));
        }
        pGVar13 = (GLRParser *)operator_new(0x38);
        psVar12 = Production::getFromP_abi_cxx11_(pPVar4);
        Production::Production
                  ((Production *)pGVar13,psVar12,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_278);
        local_248._0_8_ = pGVar13;
        std::
        _Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
        ::_M_insert_unique<Production*const&>
                  ((_Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
                    *)local_1c8,(Production **)local_248);
        psVar12 = Production::getFromP_abi_cxx11_(pPVar4);
        sVar5 = psVar12->_M_string_length;
        if (sVar5 == local_2b0._M_string_length) {
          if (sVar5 == 0) {
            bVar24 = true;
          }
          else {
            iVar9 = bcmp((psVar12->_M_dataplus)._M_p,local_2b0._M_dataplus._M_p,sVar5);
            bVar24 = iVar9 == 0;
          }
        }
        else {
          bVar24 = false;
        }
        if ((uVar23 == 0xffffffffffffffff) && (bVar24)) {
          local_190 = (GLRParser *)local_248._0_8_;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_278);
        uVar23 = uVar23 + 1;
        lVar22 = lVar22 + 0x20;
      } while (uVar23 < (ulong)((long)(pvVar11->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pvVar11->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 5));
      uVar19 = uVar19 + 8;
    } while ((Production **)uVar19 != local_288);
  }
  local_278._0_8_ = local_190;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_278;
  std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::set
            ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)local_248,
             __l_02,(less<Production_*> *)local_1f8,(allocator_type *)local_218);
  do {
    bVar24 = closure(this,(set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                           *)local_248,
                     (set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                     local_1c8);
  } while (bVar24);
  pGVar14 = (GLRState *)operator_new(0xb8);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,local_2b0._M_dataplus._M_p,
             local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
  std::
  _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
  ::_Rb_tree(&local_90,
             (_Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
              *)local_248);
  GLRState::GLRState(pGVar14,&local_e0,
                     (set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                     &local_90);
  std::
  _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
  ::~_Rb_tree(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_108 = pGVar14;
  pVar25 = std::
           _Rb_tree<GLRState*,GLRState*,std::_Identity<GLRState*>,std::less<GLRState*>,std::allocator<GLRState*>>
           ::_M_insert_unique<GLRState*const&>(local_198,&local_108);
  uVar19 = pVar25._8_8_;
  this->startState = local_108;
  iVar9 = 2;
  do {
    local_288 = (Production **)CONCAT44(local_288._4_4_,iVar9);
    local_218._0_8_ = local_218 + 0x10;
    local_218._8_8_ = (_Base_ptr)0x0;
    local_218[0x10] = '\0';
    if ((this->states)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      uVar23 = 0;
      local_2e0 = (GLRState *)0x0;
      iVar9 = 0;
LAB_00131475:
      p_Var18 = (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      auVar26._8_8_ = uVar19;
      auVar26._0_8_ = p_Var18;
      if (iVar9 < 1) {
        if (iVar9 != 0) {
          do {
            auVar26 = std::_Rb_tree_decrement(p_Var18);
            p_Var18 = auVar26._0_8_;
            uVar23 = uVar23 + 1;
          } while (uVar23 != 0);
        }
      }
      else {
        do {
          auVar26 = std::_Rb_tree_increment(p_Var18);
          p_Var18 = auVar26._0_8_;
          uVar23 = uVar23 - 1;
        } while (uVar23 != 0);
      }
      uVar19 = auVar26._8_8_;
      pGVar14 = *(GLRState **)(auVar26._0_8_ + 0x20);
      bVar24 = true;
      if ((pGVar14->prodEstablished)._M_t._M_impl.super__Rb_tree_header._M_node_count <
          (pGVar14->productions)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        p_Var18 = (pGVar14->prodEstablished)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var16 = (pGVar14->productions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var1 = &(pGVar14->prodEstablished)._M_t._M_impl.super__Rb_tree_header;
        do {
          p_Var15 = p_Var18;
          if ((_Rb_tree_header *)p_Var18 != p_Var1) {
            lVar22 = *(long *)(p_Var16 + 1);
            do {
              if (*(long *)(p_Var15 + 1) == lVar22) break;
              p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
            } while ((_Rb_tree_header *)p_Var15 != p_Var1);
          }
          if ((_Rb_tree_header *)p_Var15 == p_Var1) goto LAB_001314ff;
          p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
        } while( true );
      }
      goto LAB_0013157b;
    }
    local_2e0 = (GLRState *)0x0;
LAB_001315a6:
    uVar7 = local_218._8_8_;
    if ((_Base_ptr)local_218._8_8_ == (_Base_ptr)0x0) {
      iVar9 = (uint)local_288;
    }
    else {
      local_278._8_4_ = _S_red;
      local_268._0_8_ = (pointer)0x0;
      p_Var18 = (_Rb_tree_node_base *)(local_278 + 8);
      local_250 = (_Base_ptr)0x0;
      auVar28._8_8_ = uVar19;
      auVar28._0_8_ = (local_2e0->productions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_268._8_8_ = p_Var18;
      local_268._16_8_ = p_Var18;
      while( true ) {
        p_Var16 = auVar28._0_8_;
        if ((_Rb_tree_header *)p_Var16 ==
            &(local_2e0->productions)._M_t._M_impl.super__Rb_tree_header) break;
        local_2d0._0_8_ = *(undefined8 *)(p_Var16 + 1);
        symbolAfterMarker_abi_cxx11_((string *)local_1f8,(GLRParser *)local_2d0._0_8_,auVar28._8_8_)
        ;
        if ((_Base_ptr)local_218._8_8_ == (_Base_ptr)CONCAT44(local_1f8._12_4_,local_1f8._8_4_)) {
          if ((_Base_ptr)local_218._8_8_ == (_Base_ptr)0x0) {
            bVar24 = true;
          }
          else {
            iVar9 = bcmp((void *)local_218._0_8_,(void *)local_1f8._0_8_,local_218._8_8_);
            bVar24 = iVar9 == 0;
          }
        }
        else {
          bVar24 = false;
        }
        if ((GLRState *)local_1f8._0_8_ != (GLRState *)local_1e8) {
          operator_delete((void *)local_1f8._0_8_,(ulong)(local_1e8._0_8_ + 1));
        }
        if (bVar24) {
          std::
          _Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
          ::_M_insert_unique<Production*const&>
                    ((_Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
                      *)local_278,(Production **)local_2d0);
        }
        auVar28 = std::_Rb_tree_increment(p_Var16);
      }
      local_1f8._8_4_ = _S_red;
      local_1e8._0_8_ = (_Base_ptr)0x0;
      local_1e8._8_8_ = local_1f8 + 8;
      local_1e8._24_8_ = (_Base_ptr)0x0;
      local_1e8._16_8_ = local_1e8._8_8_;
      p_Var16 = (_Rb_tree_node_base *)local_1c8._24_8_;
      p_Var15 = (_Rb_tree_node_base *)local_268._8_8_;
      while (local_1c8._24_8_ = p_Var16, p_Var15 != p_Var18) {
        if (p_Var16 != (_Rb_tree_node_base *)(local_1c8 + 8)) {
          pPVar4 = *(Production **)(p_Var15 + 1);
          do {
            local_2d0._0_8_ = *(undefined8 *)(p_Var16 + 1);
            bVar24 = isMarkerMovedRight(pPVar4,(Production *)local_2d0._0_8_);
            if (bVar24) {
              std::
              _Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
              ::_M_insert_unique<Production*const&>
                        ((_Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
                          *)local_1f8,(Production **)local_2d0);
            }
            p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
          } while (p_Var16 != (_Rb_tree_node_base *)(local_1c8 + 8));
        }
        p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
        p_Var16 = (_Rb_tree_node_base *)local_1c8._24_8_;
      }
      uVar6 = (uint)local_288;
      __val = -(uint)local_288;
      if (0 < (int)(uint)local_288) {
        __val = (uint)local_288;
      }
      __len = 1;
      if (9 < __val) {
        uVar23 = (ulong)__val;
        uVar20 = 4;
        do {
          __len = uVar20;
          uVar10 = (uint)uVar23;
          if (uVar10 < 100) {
            __len = __len - 2;
            goto LAB_001317c5;
          }
          if (uVar10 < 1000) {
            __len = __len - 1;
            goto LAB_001317c5;
          }
          if (uVar10 < 10000) goto LAB_001317c5;
          uVar23 = uVar23 / 10000;
          uVar20 = __len + 4;
        } while (99999 < uVar10);
        __len = __len + 1;
      }
LAB_001317c5:
      uVar20 = (uint)local_288 >> 0x1f;
      local_188[0] = (GLRState *)local_178;
      std::__cxx11::string::_M_construct
                ((ulong)local_188,(char)__len - ((char)((ulong)local_288 >> 0x18) >> 7));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)&(local_188[0]->name)._M_dataplus._M_p + (ulong)uVar20),__len,__val)
      ;
      puVar17 = (undefined8 *)std::__cxx11::string::replace((ulong)local_188,0,(char *)0x0,0x144729)
      ;
      pGVar13 = (GLRParser *)(puVar17 + 2);
      if ((GLRParser *)*puVar17 == pGVar13) {
        local_2d0._16_8_ = *(undefined8 *)pGVar13;
        local_2d0._24_8_ = puVar17[3];
        local_2d0._0_8_ = (GLRParser *)(local_2d0 + 0x10);
      }
      else {
        local_2d0._16_8_ = *(undefined8 *)pGVar13;
        local_2d0._0_8_ = (GLRParser *)*puVar17;
      }
      local_2d0._8_8_ = puVar17[1];
      *puVar17 = pGVar13;
      puVar17[1] = 0;
      *(undefined1 *)(puVar17 + 2) = 0;
      if (local_188[0] != (GLRState *)local_178) {
        operator_delete(local_188[0],(ulong)(local_178._0_8_ + 1));
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                (local_290,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
      do {
        bVar24 = closure(this,(set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                               *)local_1f8,
                         (set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                          *)local_1c8);
      } while (bVar24);
      local_188[0] = (GLRState *)0x0;
      p_Var18 = (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var18 == local_280) {
LAB_00131947:
        pGVar14 = (GLRState *)operator_new(0xb8);
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_128,local_2d0._0_8_,(pointer)(local_2d0._0_8_ + local_2d0._8_8_)
                  );
        std::
        _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
        ::_Rb_tree(&local_c0,
                   (_Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
                    *)local_1f8);
        GLRState::GLRState(pGVar14,&local_128,
                           (set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                            *)&local_c0);
        local_188[0] = pGVar14;
        std::
        _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
        ::~_Rb_tree(&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        std::
        _Rb_tree<GLRState*,GLRState*,std::_Identity<GLRState*>,std::less<GLRState*>,std::allocator<GLRState*>>
        ::_M_insert_unique<GLRState*const&>(local_198,local_188);
      }
      else {
        bVar24 = false;
        do {
          pGVar14 = *(GLRState **)(p_Var18 + 1);
          if (((_Base_ptr)(pGVar14->productions)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
               (_Base_ptr)local_1e8._24_8_) &&
             (bVar8 = std::__equal<false>::
                      equal<std::_Rb_tree_const_iterator<Production*>,std::_Rb_tree_const_iterator<Production*>>
                                ((pGVar14->productions)._M_t._M_impl.super__Rb_tree_header._M_header
                                 ._M_left,(_Rb_tree_const_iterator<Production_*>)
                                          &(pGVar14->productions)._M_t._M_impl.super__Rb_tree_header
                                 ,(_Rb_tree_const_iterator<Production_*>)local_1e8._8_8_), bVar8)) {
            std::__cxx11::string::_M_assign((string *)local_2d0);
            bVar24 = true;
            local_188[0] = pGVar14;
          }
          p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
        } while (p_Var18 != local_280);
        if (!bVar24) goto LAB_00131947;
      }
      GLRState::addStateTo(local_2e0,local_188[0],(string *)local_218);
      if ((GLRParser *)local_2d0._0_8_ != (GLRParser *)(local_2d0 + 0x10)) {
        operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
      }
      std::
      _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
      ::~_Rb_tree((_Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
                   *)local_1f8);
      std::
      _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
      ::~_Rb_tree((_Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
                   *)local_278);
      uVar19 = extraout_RDX_01;
      iVar9 = uVar6 + 1;
    }
    if ((_Base_ptr)local_218._0_8_ != (_Base_ptr)(local_218 + 0x10)) {
      operator_delete((void *)local_218._0_8_,CONCAT71(local_218._17_7_,local_218[0x10]) + 1);
      uVar19 = extraout_RDX_02;
    }
    if ((_Base_ptr)uVar7 == (_Base_ptr)0x0) {
      p_Var18 = (this->states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var18 != local_280) {
        do {
          lVar22 = *(long *)(p_Var18 + 1);
          p_Var16 = *(_Rb_tree_node_base **)(lVar22 + 0x70);
          if (p_Var16 != (_Rb_tree_node_base *)(lVar22 + 0x60)) {
            bVar24 = false;
            do {
              pvVar11 = Production::getToP_abi_cxx11_(*(Production **)(p_Var16 + 1));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1f8,pvVar11);
              uVar19 = local_1f8._0_8_;
              pGVar14 = (GLRState *)CONCAT44(local_1f8._12_4_,local_1f8._8_4_);
              if ((GLRState *)local_1f8._0_8_ == pGVar14) {
LAB_00131afd:
                bVar8 = false;
              }
              else {
                getMarker_abi_cxx11_();
                sVar5 = *(size_t *)(uVar19 + (long)pGVar14 + (-0x18 - uVar19));
                if (sVar5 != CONCAT44(local_278._12_4_,local_278._8_4_)) goto LAB_00131afd;
                if (sVar5 == 0) {
                  bVar8 = true;
                }
                else {
                  iVar9 = bcmp(*(void **)(uVar19 + (long)pGVar14 + (-0x20 - uVar19)),
                               (void *)local_278._0_8_,sVar5);
                  bVar8 = iVar9 == 0;
                }
              }
              if (((GLRState *)uVar19 != pGVar14) &&
                 ((GLRParser *)local_278._0_8_ != (GLRParser *)local_268)) {
                operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
              }
              if (bVar8) {
                bVar24 = true;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1f8);
              p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
            } while (p_Var16 != (_Rb_tree_node_base *)(lVar22 + 0x60));
            if (bVar24) {
              *(undefined1 *)(lVar22 + 0x20) = 1;
            }
          }
          p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
        } while (p_Var18 != local_280);
      }
      std::
      _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
      ::~_Rb_tree((_Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
                   *)local_248);
      std::
      _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
      ::~_Rb_tree((_Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
                   *)local_1c8);
      if (local_148 != (_Base_ptr)local_138) {
        operator_delete(local_148,(ulong)((long)&local_138[0]->_M_color + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if ((Production **)local_168._M_allocated_capacity != (Production **)0x0) {
        operator_delete((void *)local_168._M_allocated_capacity,(long)local_158 - local_168._0_8_);
      }
      return;
    }
  } while( true );
LAB_001314ff:
  pGVar13 = *(GLRParser **)(p_Var16 + 1);
  local_278._0_8_ = pGVar13;
  pVar27 = std::
           _Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
           ::_M_insert_unique<Production*const&>
                     ((_Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
                       *)&pGVar14->prodEstablished,(Production **)local_278);
  symbolAfterMarker_abi_cxx11_((string *)local_278,pGVar13,pVar27._8_8_);
  std::__cxx11::string::operator=((string *)local_218,(string *)local_278);
  uVar19 = extraout_RDX;
  if ((GLRParser *)local_278._0_8_ != (GLRParser *)local_268) {
    operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
    uVar19 = extraout_RDX_00;
  }
  bVar24 = (_Base_ptr)local_218._8_8_ == (_Base_ptr)0x0;
  if (!bVar24) {
    local_2e0 = pGVar14;
  }
  iVar9 = iVar9 - (uint)bVar24;
LAB_0013157b:
  if (!bVar24) goto LAB_001315a6;
  iVar9 = iVar9 + 1;
  uVar23 = (ulong)iVar9;
  if ((this->states)._M_t._M_impl.super__Rb_tree_header._M_node_count <= uVar23) goto LAB_001315a6;
  goto LAB_00131475;
}

Assistant:

GLRParser::GLRParser(CFG *cfg, bool verbose) : verbose(verbose) {

    cfg->splitUpLongerTerminals();

    // Convert vector to set
    for (const auto &c: cfg->getNonTerminalsV()) {
        nonTerminalsV.insert(c);
    }
    for (const auto &c: cfg->getTerminalsT()) {
        terminalsT.insert(c);
    }

    // TODO: fix all terminals only 1 char
    std::vector<Production *> productionsP = cfg->getProductionsP();
    std::string startS = cfg->getStartS();

    int stateNr = 1;

    // Start by creating a new start state
    std::string oldStartState = startS;
    startS = startStateName();
    stateNr++;
    nonTerminalsV.insert(startS);
    // and letting this start state point to the original one
    auto *start = new Production(startS, {oldStartState});
    // (This ensures the start state appears in only one rewrite rule)
    productionsP.push_back(start);

    acceptState = new GLRState("accept", {new Production("accept", {startS})});

    // Introduce the marker ^ in all productions
    std::set<Production *> markedProductions = {};
    for (auto production: productionsP) {
        const std::vector<std::string> &prodTo = production->getToP();
        for (int i = 0; i <= prodTo.size(); ++i) { // TODO: Check whether <= doesn't give an overflow error
            std::vector<std::string> prodToMarked = prodTo;
            prodToMarked.insert(prodToMarked.begin() + i, getMarker());
            auto *markedProduction = new Production(production->getFromP(), prodToMarked);
            markedProductions.insert(markedProduction);
            if (production->getFromP() == startS && i == 0) {
                start = markedProduction;
            }
        }
    }


    // 1. Form the closure of the set containing the single marked rule S' -> ^S. Establish this set as the initial ste
    //     in the transition diastagram.
    // Start state is the new start
    std::set<Production *> startClosure = {start};
    while (closure(startClosure, markedProductions)) {}
    auto *newState = new GLRState(startS, startClosure);
    states.insert(newState);
    startState = newState;
//    std::set<Production *> establishedRulesInState = startClosure;
    // States is the vector containing all established states
//    std::set<Production *> processedProductions = {};


    // 2. While possible without redundancy do the following:
    while ("Possible without redundancy") { // Redundant once all productions are processed
        // a. Select a symbol s (terminal or nonterminal) appearing emmediately to the right of the marker in a rule in
        //     some established state A.
        std::string s;
        GLRState *stateA{};
        for (int i = 0; i < states.size(); ++i) {
            // Get the i-th element
            auto glrStateItr = states.begin();
            std::advance(glrStateItr, i);
            GLRState *glrState = *glrStateItr;

            if (glrState->getProductions().size() <= glrState->getProdEstablished().size()) {
                continue;
            }

//            std::cout << glrState->getName() << " has " << glrState->getProdEstablished().size() << " of " << glrState->getProductions().size()  << " productions established."<< std::endl;

            auto productionItr = glrState->getProductions().begin();
            Production *production;
            while (true) {
                // Check whether the current production is already established
                if (std::find(glrState->getProdEstablished().begin(), glrState->getProdEstablished().end(),
                              *productionItr) == glrState->getProdEstablished().end()) {
                    production = *productionItr;
                    glrState->increaseEstablished(production);
                    break;
                } else {
                    // TODO: fix stuck in Moved loop
//                    std::cerr << "Moved" << std::endl;
                    productionItr++;
                }
            }


            s = symbolAfterMarker(production);
            // Marker at end
            if (s.empty()) {
                i--;
                continue;
            }
            stateA = glrState;
            break;

        }
        if (s.empty()) {
//            std::cout << "No more found." << std::endl;
            break;
        }

        // b. Let X denote the collection of all marked rules in A that have s immediately to the right of their markers.
        std::set<Production *> sImmRightX;
        for (Production *production: stateA->getProductions()) {
            if (s == symbolAfterMarker(production)) {
                sImmRightX.insert(production);
            }
        }

        // c. Let Y be the set of marked rules obtained by moving the marker in each rule in X to the right of the symbol s.
        std::set<Production *> sMovedRightOfX;
        for (Production *production: sImmRightX) {
            for (Production *prod: markedProductions) {
                if (isMarkerMovedRight(production, prod)) {
                    sMovedRightOfX.insert(prod);
                }
            }
        }

        // d. If the closure of Y has not yet been established as a state, do so now.

        // Find a new name for the variable
//        char newVariable = 'A';
//        while (inVector(toString(newVariable), nonTerminalsV)) { newVariable++; }
        std::string var = "STATE#" + std::to_string(stateNr++);
        nonTerminalsV.insert(var);

        // Calculate the closure
        while (closure(sMovedRightOfX, markedProductions)) {}

        // Find another state with this closure
        GLRState *closureY{};
        bool stateExists = false;
        for (GLRState *s2: states) {
            if (s2->getProductions() == sMovedRightOfX) {
                var = s2->getName();
                stateExists = true;
                closureY = s2;
            }
        }

        if (!stateExists) {
            closureY = new GLRState(var, sMovedRightOfX);
            states.insert(closureY);
        }

        // e. Draw an arc labeled s from state A to closure of Y
        stateA->addStateTo(closureY, s);
//        std::string filename = "output/yeet" + var + ".dot";
//        toDot(filename);
    }

    // 3. Let each state represented by marked rules in terminal form be accept states in the automaton.
    for (auto state: states) {
        bool containsTerminalProduction = false; // TODO: check containsProduction or allProductions
        for (auto rule: state->getProductions()) {
            auto prodTo = rule->getToP();
            if (!prodTo.empty() && prodTo[prodTo.size() - 1] == getMarker()) {
                containsTerminalProduction = true;
            }
        }
        if (containsTerminalProduction) {
            state->setAccepting(true);
        }
    }

//    toDot("output/GLRParserTransitionScheme.dot");
//    buildTable();
//    printTable();
}